

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_grow(mp_int *a,int size)

{
  int iVar1;
  mp_digit *pmVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  if (a->alloc < size) {
    iVar5 = (size - size % 0x20) + 0x40;
    pmVar2 = (mp_digit *)realloc(a->dp,(long)iVar5 * 8);
    if (pmVar2 == (mp_digit *)0x0) {
      iVar4 = -2;
    }
    else {
      a->dp = pmVar2;
      iVar1 = a->alloc;
      a->alloc = iVar5;
      for (lVar3 = (long)iVar1; lVar3 < iVar5; lVar3 = lVar3 + 1) {
        pmVar2[lVar3] = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int mp_grow (mp_int * a, int size)
{
  int     i;
  mp_digit *tmp;

  /* if the alloc size is smaller alloc more ram */
  if (a->alloc < size) {
    /* ensure there are always at least MP_PREC digits extra on top */
    size += (MP_PREC * 2) - (size % MP_PREC);

    /* reallocate the array a->dp
     *
     * We store the return in a temporary variable
     * in case the operation failed we don't want
     * to overwrite the dp member of a.
     */
    tmp = OPT_CAST(mp_digit) XREALLOC (a->dp, sizeof (mp_digit) * size);
    if (tmp == NULL) {
      /* reallocation failed but "a" is still valid [can be freed] */
      return MP_MEM;
    }

    /* reallocation succeeded so set a->dp */
    a->dp = tmp;

    /* zero excess digits */
    i        = a->alloc;
    a->alloc = size;
    for (; i < a->alloc; i++) {
      a->dp[i] = 0;
    }
  }
  return MP_OKAY;
}